

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BailOutRecord::BailOutInlinedCommon
              (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,uint32 bailOutOffset,
              void *returnAddress,BailOutKind bailOutKind,ImplicitCallFlags savedImplicitCallFlags,
              Var branchValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *src;
  Var pvVar5;
  ScriptFunction *function;
  Var result;
  ScriptFunction *innerMostInlinee;
  BailOutReturnValue bailOutReturnValue;
  BailOutRecord *currentBailOutRecord;
  Var registerSaves [49];
  ImplicitCallFlags savedImplicitCallFlags_local;
  BailOutKind bailOutKind_local;
  void *returnAddress_local;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  if (bailOutRecord->parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x4a1,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
  this = Js::ScriptContext::GetThreadContext(pSVar4);
  src = ThreadContext::GetBailOutRegisterSaveSpace(this);
  js_memcpy_s(&currentBailOutRecord,0x188,src,0x188);
  result = (Var)0x0;
  bailOutReturnValue._8_8_ = bailOutRecord;
  BailOutInlinedHelper
            (layout,(BailOutRecord **)&bailOutReturnValue.returnValueRegSlot,bailOutOffset,
             returnAddress,bailOutKind,&currentBailOutRecord,(BailOutReturnValue *)&innerMostInlinee
             ,(ScriptFunction **)&result,false,branchValue);
  pSVar4 = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
  SetHasBailedOutBit(bailOutRecord,pSVar4);
  pvVar5 = BailOutCommonNoCodeGen
                     (layout,(BailOutRecord *)bailOutReturnValue._8_8_,
                      *(uint32 *)(bailOutReturnValue._8_8_ + 0x34),returnAddress,bailOutKind,
                      branchValue,&currentBailOutRecord,(BailOutReturnValue *)&innerMostInlinee,
                      (void *)0x0);
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleFunctionCodeGen
            (function,(ScriptFunction *)result,(BailOutRecord *)bailOutReturnValue._8_8_,bailOutKind
             ,bailOutOffset,savedImplicitCallFlags,returnAddress);
  return pvVar5;
}

Assistant:

Js::Var
BailOutRecord::BailOutInlinedCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord, uint32 bailOutOffset,
    void * returnAddress, IR::BailOutKind bailOutKind, Js::ImplicitCallFlags savedImplicitCallFlags, Js::Var branchValue)
{
    Assert(bailOutRecord->parent != nullptr);

    // Need to capture the register save, one of the bailout might get into jitted code again and bailout again
    // overwriting the current register saves
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));
    BailOutRecord const * currentBailOutRecord = bailOutRecord;
    BailOutReturnValue bailOutReturnValue;
    Js::ScriptFunction * innerMostInlinee = nullptr;
    BailOutInlinedHelper(layout, currentBailOutRecord, bailOutOffset, returnAddress, bailOutKind, registerSaves, &bailOutReturnValue, &innerMostInlinee, false, branchValue);
    SetHasBailedOutBit(bailOutRecord, layout->functionObject->GetScriptContext());
    Js::Var result = BailOutCommonNoCodeGen(layout, currentBailOutRecord, currentBailOutRecord->bailOutOffset, returnAddress, bailOutKind, branchValue,
        registerSaves, &bailOutReturnValue);
    ScheduleFunctionCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), innerMostInlinee, currentBailOutRecord, bailOutKind, bailOutOffset, savedImplicitCallFlags, returnAddress);
    return result;
}